

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::UnknownFieldSet::SerializeToCord(UnknownFieldSet *this,Cord *output)

{
  bool bVar1;
  size_t size_hint;
  CodedOutputStream coded_output_stream;
  CordOutputStream cord_output_stream;
  CodedOutputStream CStack_a8;
  CordOutputStream local_58;
  
  size_hint = internal::WireFormat::ComputeUnknownFieldsSize(this);
  io::CordOutputStream::CordOutputStream(&local_58,size_hint);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::CordOutputStream,void>
            (&CStack_a8,&local_58);
  bVar1 = SerializeToCodedStream(this,&CStack_a8);
  io::CodedOutputStream::~CodedOutputStream(&CStack_a8);
  if (bVar1) {
    io::CordOutputStream::Consume((CordOutputStream *)&CStack_a8);
    absl::lts_20250127::Cord::InlineRep::operator=(&output->contents_,(InlineRep *)&CStack_a8);
    absl::lts_20250127::Cord::~Cord((Cord *)&CStack_a8);
  }
  io::CordOutputStream::~CordOutputStream(&local_58);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::SerializeToCord(absl::Cord* output) const {
  const size_t size =
      google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(*this);
  io::CordOutputStream cord_output_stream(size);
  {
    io::CodedOutputStream coded_output_stream(&cord_output_stream);
    if (!SerializeToCodedStream(&coded_output_stream)) return false;
  }
  *output = cord_output_stream.Consume();
  return true;
}